

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  xmlGenericErrorFunc p_Var2;
  _xmlCatalogEntry **pp_Var3;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *pxVar9;
  xmlChar *pubID_00;
  xmlCatalogEntryPtr ctx;
  long lVar10;
  int nbList;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  xmlCatalogEntryPtr pxVar14;
  _xmlCatalogEntry *p_Var15;
  ulong uVar16;
  _xmlCatalogEntry *p_Var17;
  xmlChar *delegates [50];
  xmlCatalogEntryPtr local_1d8;
  int local_1d0;
  undefined8 auStack_1c8 [51];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar6 = xmlCatalogNormalizePublic(pubID);
  if ((pxVar6 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar6 != '\0')) {
    pubID = pxVar6;
  }
  iVar4 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
  if (iVar4 == 0) {
    pubID_00 = xmlCatalogUnWrapURN(pubID);
    pxVar9 = pubID_00;
    if (xmlDebugCatalogs == 0) goto LAB_0013ace9;
    pp_Var7 = __xmlGenericError();
    p_Var2 = *pp_Var7;
    ppvVar8 = __xmlGenericErrorContext();
    if (pubID_00 == (xmlChar *)0x0) {
      (*p_Var2)(*ppvVar8,"Public URN ID %s expanded to NULL\n",pubID);
      pxVar9 = xmlCatalogListXMLResolve(catal,(xmlChar *)0x0,sysID);
      goto LAB_0013ad02;
    }
    (*p_Var2)(*ppvVar8,"Public URN ID expanded to %s\n",pubID_00);
    pxVar9 = xmlCatalogListXMLResolve(catal,pubID_00,sysID);
  }
  else {
    iVar4 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar4 != 0) {
      do {
        if (catal->type == XML_CATA_CATALOG) {
          ctx = catal->children;
          if (ctx == (xmlCatalogEntryPtr)0x0) {
            xmlFetchXMLCatalogFile(catal);
            ctx = catal->children;
            if (ctx == (xmlCatalogEntryPtr)0x0) goto LAB_0013abec;
          }
          if (ctx->depth < 0x33) {
            ctx->depth = ctx->depth + 1;
            if (sysID != (xmlChar *)0x0) {
              uVar16 = 0;
              local_1d8 = (xmlCatalogEntryPtr)0x0;
              iVar4 = 0;
              local_1d0 = 0;
              p_Var15 = ctx;
              do {
                switch(p_Var15->type) {
                case XML_CATA_NEXT_CATALOG:
                  iVar4 = iVar4 + 1;
                  break;
                case XML_CATA_SYSTEM:
                  iVar12 = xmlStrEqual(sysID,p_Var15->name);
                  if (iVar12 != 0) {
                    if (xmlDebugCatalogs != 0) {
                      pp_Var7 = __xmlGenericError();
                      p_Var2 = *pp_Var7;
                      ppvVar8 = __xmlGenericErrorContext();
                      (*p_Var2)(*ppvVar8,"Found system match %s, using %s\n",p_Var15->name,
                                p_Var15->URL);
                    }
                    ctx->depth = ctx->depth + -1;
                    pxVar9 = xmlStrdup(p_Var15->URL);
                    goto LAB_0013abd1;
                  }
                  break;
                case XML_CATA_REWRITE_SYSTEM:
                  uVar11 = xmlStrlen(p_Var15->name);
                  if (((int)uVar16 < (int)uVar11) &&
                     (iVar12 = xmlStrncmp(sysID,p_Var15->name,uVar11), iVar12 == 0)) {
                    uVar16 = (ulong)uVar11;
                    local_1d8 = p_Var15;
                  }
                  break;
                case XML_CATA_DELEGATE_SYSTEM:
                  pxVar9 = p_Var15->name;
                  iVar12 = xmlStrlen(pxVar9);
                  iVar12 = xmlStrncmp(sysID,pxVar9,iVar12);
                  local_1d0 = local_1d0 + (uint)(iVar12 == 0);
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_xmlCatalogEntry *)0x0);
              if (local_1d8 == (xmlCatalogEntryPtr)0x0) {
                if (local_1d0 == 0) goto LAB_0013aa4f;
                uVar11 = 0;
                p_Var15 = ctx;
                do {
                  p_Var17 = p_Var15;
                  while (p_Var17->type == XML_CATA_DELEGATE_SYSTEM) {
                    pxVar9 = p_Var17->name;
                    iVar4 = xmlStrlen(pxVar9);
                    iVar4 = xmlStrncmp(sysID,pxVar9,iVar4);
                    if (iVar4 != 0) break;
                    if ((int)uVar11 < 1) {
LAB_0013aebd:
                      lVar10 = (long)(int)uVar11;
                      uVar11 = uVar11 + 1;
                      auStack_1c8[lVar10] = p_Var15->URL;
LAB_0013aece:
                      pxVar14 = p_Var15->children;
                      p_Var17 = p_Var15;
                      if (pxVar14 == (xmlCatalogEntryPtr)0x0) {
                        xmlFetchXMLCatalogFile(p_Var15);
                        pxVar14 = p_Var15->children;
                        if (pxVar14 == (xmlCatalogEntryPtr)0x0) break;
                      }
                      if (xmlDebugCatalogs != 0) {
                        pp_Var7 = __xmlGenericError();
                        p_Var2 = *pp_Var7;
                        ppvVar8 = __xmlGenericErrorContext();
                        (*p_Var2)(*ppvVar8,"Trying system delegate %s\n",p_Var15->URL);
                        pxVar14 = p_Var15->children;
                      }
                      pxVar9 = xmlCatalogListXMLResolve(pxVar14,(xmlChar *)0x0,sysID);
                      if (pxVar9 != (xmlChar *)0x0) goto LAB_0013af48;
                      break;
                    }
                    uVar16 = 0;
                    while (iVar4 = xmlStrEqual(p_Var17->URL,(xmlChar *)auStack_1c8[uVar16]),
                          iVar4 == 0) {
                      uVar16 = uVar16 + 1;
                      if (uVar11 == uVar16) {
                        p_Var15 = p_Var17;
                        if ((int)uVar11 < 0x32) goto LAB_0013aebd;
                        goto LAB_0013aece;
                      }
                    }
                    p_Var17 = p_Var17->next;
                    if (p_Var17 == (_xmlCatalogEntry *)0x0) goto LAB_0013af3c;
                  }
                  p_Var15 = p_Var17->next;
                } while (p_Var15 != (_xmlCatalogEntry *)0x0);
                goto LAB_0013af3c;
              }
              if (xmlDebugCatalogs != 0) {
                pp_Var7 = __xmlGenericError();
                p_Var2 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                (*p_Var2)(*ppvVar8,"Using rewriting rule %s\n",local_1d8->name);
              }
              pxVar9 = xmlStrdup(local_1d8->URL);
              if (pxVar9 == (xmlChar *)0x0) {
                pxVar9 = (xmlChar *)0x0;
              }
              else {
                pxVar9 = xmlStrcat(pxVar9,sysID + uVar16);
              }
              ctx->depth = ctx->depth + -1;
LAB_0013abd1:
              if (pxVar9 == (xmlChar *)0x0) goto LAB_0013abda;
              goto LAB_0013ad02;
            }
            iVar4 = 0;
LAB_0013aa4f:
            if (pubID != (xmlChar *)0x0) {
              iVar12 = 0;
              p_Var15 = ctx;
              do {
                xVar1 = p_Var15->type;
                if (xVar1 == XML_CATA_NEXT_CATALOG) {
                  iVar4 = iVar4 + (uint)(sysID == (xmlChar *)0x0);
                }
                else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                  pxVar9 = p_Var15->name;
                  iVar5 = xmlStrlen(pxVar9);
                  iVar5 = xmlStrncmp(pubID,pxVar9,iVar5);
                  if (iVar5 == 0) {
                    iVar12 = iVar12 + (uint)(p_Var15->prefer == XML_CATA_PREFER_PUBLIC);
                  }
                }
                else if ((xVar1 == XML_CATA_PUBLIC) &&
                        (iVar5 = xmlStrEqual(pubID,p_Var15->name), iVar5 != 0)) {
                  if (xmlDebugCatalogs != 0) {
                    pp_Var7 = __xmlGenericError();
                    p_Var2 = *pp_Var7;
                    ppvVar8 = __xmlGenericErrorContext();
                    (*p_Var2)(*ppvVar8,"Found public match %s\n",p_Var15->name);
                  }
                  ctx->depth = ctx->depth + -1;
                  pxVar9 = xmlStrdup(p_Var15->URL);
                  goto LAB_0013abd1;
                }
                p_Var15 = p_Var15->next;
              } while (p_Var15 != (_xmlCatalogEntry *)0x0);
              if (iVar12 != 0) {
                uVar11 = 0;
                p_Var15 = ctx;
                goto LAB_0013ad36;
              }
            }
            p_Var15 = ctx;
            if (iVar4 != 0) {
              do {
                if (p_Var15->type == XML_CATA_NEXT_CATALOG) {
                  pxVar14 = p_Var15->children;
                  if (pxVar14 == (xmlCatalogEntryPtr)0x0) {
                    xmlFetchXMLCatalogFile(p_Var15);
                    pxVar14 = p_Var15->children;
                    if (pxVar14 == (xmlCatalogEntryPtr)0x0) goto LAB_0013ab26;
                  }
                  pxVar9 = xmlCatalogListXMLResolve(pxVar14,pubID,sysID);
                  if (pxVar9 != (xmlChar *)0x0) {
                    ctx->depth = ctx->depth + -1;
                    goto LAB_0013ad02;
                  }
                  if (0x32 < ctx->depth) goto LAB_0013abda;
                }
LAB_0013ab26:
                pp_Var3 = &p_Var15->next;
                p_Var15 = *pp_Var3;
              } while (*pp_Var3 != (_xmlCatalogEntry *)0x0);
            }
            ctx->depth = ctx->depth + -1;
            goto LAB_0013abda;
          }
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctx,
                          (void *)0x0,0x14,0x676,XML_ERR_ERROR,(char *)0x0,0,(char *)ctx->name,
                          (char *)0x0,(char *)0x0,0,0,"Detected recursion in catalog %s\n",ctx->name
                          ,0,0);
LAB_0013abda:
          if (catal->children->depth < 0x33) goto LAB_0013abec;
          break;
        }
LAB_0013abec:
        catal = catal->next;
      } while (catal != (_xmlCatalogEntry *)0x0);
      pxVar9 = (xmlChar *)0x0;
      goto LAB_0013ad02;
    }
    pubID_00 = xmlCatalogUnWrapURN(sysID);
    if (xmlDebugCatalogs != 0) {
      pp_Var7 = __xmlGenericError();
      p_Var2 = *pp_Var7;
      ppvVar8 = __xmlGenericErrorContext();
      if (pubID_00 == (xmlChar *)0x0) {
        pcVar13 = "System URN ID %s expanded to NULL\n";
      }
      else {
        pcVar13 = "System URN ID expanded to %s\n";
        sysID = pubID_00;
      }
      (*p_Var2)(*ppvVar8,pcVar13,sysID);
    }
    pxVar9 = pubID_00;
    if ((pubID == (xmlChar *)0x0) ||
       (iVar4 = xmlStrEqual(pubID,pubID_00), sysID = pubID_00, pxVar9 = pubID, iVar4 != 0)) {
      sysID = (xmlChar *)0x0;
    }
LAB_0013ace9:
    pxVar9 = xmlCatalogListXMLResolve(catal,pxVar9,sysID);
    if (pubID_00 == (xmlChar *)0x0) goto LAB_0013ad02;
  }
  (*xmlFree)(pubID_00);
LAB_0013ad02:
  if (pxVar6 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar6);
  }
  return pxVar9;
LAB_0013ad36:
  do {
    p_Var17 = p_Var15;
    while( true ) {
      if ((p_Var17->type != XML_CATA_DELEGATE_PUBLIC) || (p_Var17->prefer != XML_CATA_PREFER_PUBLIC)
         ) goto LAB_0013ae22;
      pxVar9 = p_Var17->name;
      iVar4 = xmlStrlen(pxVar9);
      iVar4 = xmlStrncmp(pubID,pxVar9,iVar4);
      if (iVar4 != 0) goto LAB_0013ae22;
      if ((int)uVar11 < 1) break;
      uVar16 = 0;
      while (iVar4 = xmlStrEqual(p_Var17->URL,(xmlChar *)auStack_1c8[uVar16]), iVar4 == 0) {
        uVar16 = uVar16 + 1;
        if (uVar11 == uVar16) {
          p_Var15 = p_Var17;
          if ((int)uVar11 < 0x32) goto LAB_0013adb1;
          goto LAB_0013adc2;
        }
      }
      p_Var17 = p_Var17->next;
      if (p_Var17 == (_xmlCatalogEntry *)0x0) goto LAB_0013af3c;
    }
LAB_0013adb1:
    lVar10 = (long)(int)uVar11;
    uVar11 = uVar11 + 1;
    auStack_1c8[lVar10] = p_Var15->URL;
LAB_0013adc2:
    pxVar14 = p_Var15->children;
    p_Var17 = p_Var15;
    if (pxVar14 == (xmlCatalogEntryPtr)0x0) {
      xmlFetchXMLCatalogFile(p_Var15);
      pxVar14 = p_Var15->children;
      if (pxVar14 != (xmlCatalogEntryPtr)0x0) goto LAB_0013ade1;
    }
    else {
LAB_0013ade1:
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var2 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar8,"Trying public delegate %s\n",p_Var15->URL);
        pxVar14 = p_Var15->children;
      }
      pxVar9 = xmlCatalogListXMLResolve(pxVar14,pubID,(xmlChar *)0x0);
      if (pxVar9 != (xmlChar *)0x0) goto LAB_0013af48;
    }
LAB_0013ae22:
    p_Var15 = p_Var17->next;
  } while (p_Var15 != (_xmlCatalogEntry *)0x0);
LAB_0013af3c:
  pxVar9 = (xmlChar *)0xffffffffffffffff;
LAB_0013af48:
  ctx->depth = ctx->depth + -1;
  goto LAB_0013ad02;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlGenericError(xmlGenericErrorContext,
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}